

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkMiterCofactor(Abc_Ntk_t *pNtk,Vec_Int_t *vPiValues)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  Abc_Ntk_t *pNtkMiter;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  long lVar8;
  char Buffer [1000];
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMiter.c"
                  ,0x1c6,"Abc_Ntk_t *Abc_NtkMiterCofactor(Abc_Ntk_t *, Vec_Int_t *)");
  }
  if (pNtk->vCos->nSize == 1) {
    if (pNtk->nObjCounts[8] != pNtk->vBoxes->nSize) {
      __assert_fail("Abc_NtkHasOnlyLatchBoxes(pNtk)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMiter.c"
                    ,0x1c8,"Abc_Ntk_t *Abc_NtkMiterCofactor(Abc_Ntk_t *, Vec_Int_t *)");
    }
    pNtkMiter = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
    lVar8 = 0;
    sprintf(Buffer,"%s_miter",pNtk->pName);
    pcVar4 = Extra_UtilStrsav(Buffer);
    pNtkMiter->pName = pcVar4;
    pAVar5 = Abc_NtkCo(pNtk,0);
    Abc_NtkMiterPrepare(pNtk,pNtk,pNtkMiter,1,-1,0);
    do {
      if (vPiValues->nSize <= lVar8) {
        Abc_NtkMiterAddCone(pNtk,pNtkMiter,pAVar5);
        uVar1 = *(uint *)&pAVar5->field_0x14;
        uVar2 = *(ulong *)((long)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray] + 0x40);
        pAVar5 = Abc_NtkPo(pNtkMiter,0);
        Abc_ObjAddFanin(pAVar5,(Abc_Obj_t *)(uVar1 >> 10 & 1 ^ uVar2));
        iVar3 = Abc_NtkCheck(pNtkMiter);
        if (iVar3 == 0) {
          puts("Abc_NtkMiterCofactor: The network check has failed.");
          Abc_NtkDelete(pNtkMiter);
          pNtkMiter = (Abc_Ntk_t *)0x0;
        }
        return pNtkMiter;
      }
      iVar3 = vPiValues->pArray[lVar8];
      if (iVar3 != -1) {
        if (iVar3 == 1) {
          pAVar6 = Abc_AigConst1(pNtkMiter);
        }
        else {
          if (iVar3 != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMiter.c"
                          ,0x1e3,"Abc_Ntk_t *Abc_NtkMiterCofactor(Abc_Ntk_t *, Vec_Int_t *)");
          }
          pAVar6 = Abc_AigConst1(pNtkMiter);
          pAVar6 = (Abc_Obj_t *)((ulong)pAVar6 ^ 1);
        }
        pAVar7 = Abc_NtkCi(pNtk,(int)lVar8);
        (pAVar7->field_6).pTemp = pAVar6;
      }
      lVar8 = lVar8 + 1;
    } while( true );
  }
  __assert_fail("1 == Abc_NtkCoNum(pNtk)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMiter.c"
                ,0x1c7,"Abc_Ntk_t *Abc_NtkMiterCofactor(Abc_Ntk_t *, Vec_Int_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkMiterCofactor( Abc_Ntk_t * pNtk, Vec_Int_t * vPiValues )
{
    char Buffer[1000];
    Abc_Ntk_t * pNtkMiter;
    Abc_Obj_t * pRoot, * pOutput1;
    int Value, i;

    assert( Abc_NtkIsStrash(pNtk) );
    assert( 1 == Abc_NtkCoNum(pNtk) );
    assert( Abc_NtkHasOnlyLatchBoxes(pNtk) );

    // start the new network
    pNtkMiter = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    sprintf( Buffer, "%s_miter", pNtk->pName );
    pNtkMiter->pName = Extra_UtilStrsav(Buffer);

    // get the root output
    pRoot = Abc_NtkCo( pNtk, 0 );

    // perform strashing
    Abc_NtkMiterPrepare( pNtk, pNtk, pNtkMiter, 1, -1, 0 );
    // set the first cofactor
    Vec_IntForEachEntry( vPiValues, Value, i )
    {
        if ( Value == -1 )
            continue;
        if ( Value == 0 )
        {
            Abc_NtkCi(pNtk, i)->pCopy = Abc_ObjNot( Abc_AigConst1(pNtkMiter) );
            continue;
        }
        if ( Value == 1 )
        {
            Abc_NtkCi(pNtk, i)->pCopy = Abc_AigConst1(pNtkMiter);
            continue;
        }
        assert( 0 );
    }
    // add the first cofactor
    Abc_NtkMiterAddCone( pNtk, pNtkMiter, pRoot );

    // save the output
    pOutput1 = Abc_ObjNotCond( Abc_ObjFanin0(pRoot)->pCopy, Abc_ObjFaninC0(pRoot) );

    // create the miter of the two outputs
    Abc_ObjAddFanin( Abc_NtkPo(pNtkMiter,0), pOutput1 );

    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtkMiter ) )
    {
        printf( "Abc_NtkMiterCofactor: The network check has failed.\n" );
        Abc_NtkDelete( pNtkMiter );
        return NULL;
    }
    return pNtkMiter;
}